

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateFieldOptions
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  FieldDescriptorProto *pFVar1;
  bool bVar2;
  Type TVar3;
  FieldOptions *pFVar4;
  Descriptor *pDVar5;
  MessageOptions *pMVar6;
  MessageOptions *pMVar7;
  FileDescriptor *pFVar8;
  string *psVar9;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  FieldDescriptorProto *local_20;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *field_local;
  DescriptorBuilder *this_local;
  
  local_20 = proto;
  proto_local = (FieldDescriptorProto *)field;
  field_local = (FieldDescriptor *)this;
  pFVar4 = FieldDescriptor::options(field);
  bVar2 = FieldOptions::has_experimental_map_key(pFVar4);
  if (bVar2) {
    ValidateMapKey(this,(FieldDescriptor *)proto_local,local_20);
  }
  pFVar4 = FieldDescriptor::options((FieldDescriptor *)proto_local);
  bVar2 = FieldOptions::lazy(pFVar4);
  if ((bVar2) &&
     (TVar3 = FieldDescriptor::type((FieldDescriptor *)proto_local), TVar3 != TYPE_MESSAGE)) {
    psVar9 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
    pFVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"[lazy = true] can only be specified for submessage fields.",
               &local_41);
    AddError(this,psVar9,&pFVar1->super_Message,TYPE,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  pFVar4 = FieldDescriptor::options((FieldDescriptor *)proto_local);
  bVar2 = FieldOptions::packed(pFVar4);
  if ((bVar2) && (bVar2 = FieldDescriptor::is_packable((FieldDescriptor *)proto_local), !bVar2)) {
    psVar9 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
    pFVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,
               "[packed = true] can only be specified for repeated primitive fields.",&local_79);
    AddError(this,psVar9,&pFVar1->super_Message,TYPE,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  if (proto_local->options_ != (FieldOptions *)0x0) {
    pDVar5 = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
    pMVar6 = Descriptor::options(pDVar5);
    pMVar7 = MessageOptions::default_instance();
    if (pMVar6 != pMVar7) {
      pDVar5 = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
      pMVar6 = Descriptor::options(pDVar5);
      bVar2 = MessageOptions::message_set_wire_format(pMVar6);
      if (bVar2) {
        bVar2 = FieldDescriptor::is_extension((FieldDescriptor *)proto_local);
        if (bVar2) {
          bVar2 = FieldDescriptor::is_optional((FieldDescriptor *)proto_local);
          if ((!bVar2) ||
             (TVar3 = FieldDescriptor::type((FieldDescriptor *)proto_local), TVar3 != TYPE_MESSAGE))
          {
            psVar9 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
            pFVar1 = local_20;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_a0,"Extensions of MessageSets must be optional messages.",
                       &local_a1);
            AddError(this,psVar9,&pFVar1->super_Message,TYPE,&local_a0);
            std::__cxx11::string::~string((string *)&local_a0);
            std::allocator<char>::~allocator(&local_a1);
          }
        }
        else {
          psVar9 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
          pFVar1 = local_20;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c8,"MessageSets cannot have fields, only extensions.",
                     &local_c9);
          AddError(this,psVar9,&pFVar1->super_Message,NAME,&local_c8);
          std::__cxx11::string::~string((string *)&local_c8);
          std::allocator<char>::~allocator(&local_c9);
        }
      }
    }
  }
  pFVar8 = FieldDescriptor::file((FieldDescriptor *)proto_local);
  bVar2 = IsLite(pFVar8);
  if ((bVar2) && (proto_local->options_ != (FieldOptions *)0x0)) {
    pDVar5 = FieldDescriptor::containing_type((FieldDescriptor *)proto_local);
    pFVar8 = Descriptor::file(pDVar5);
    bVar2 = IsLite(pFVar8);
    if (!bVar2) {
      psVar9 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)proto_local);
      pFVar1 = local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,
                 "Extensions to non-lite types can only be declared in non-lite files.  Note that you cannot extend a non-lite type to contain a lite type, but the reverse is allowed."
                 ,&local_f1);
      AddError(this,psVar9,&pFVar1->super_Message,EXTENDEE,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateFieldOptions(FieldDescriptor* field,
    const FieldDescriptorProto& proto) {
  if (field->options().has_experimental_map_key()) {
    ValidateMapKey(field, proto);
  }

  // Only message type fields may be lazy.
  if (field->options().lazy()) {
    if (field->type() != FieldDescriptor::TYPE_MESSAGE) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::TYPE,
               "[lazy = true] can only be specified for submessage fields.");
    }
  }

  // Only repeated primitive fields may be packed.
  if (field->options().packed() && !field->is_packable()) {
    AddError(
      field->full_name(), proto,
      DescriptorPool::ErrorCollector::TYPE,
      "[packed = true] can only be specified for repeated primitive fields.");
  }

  // Note:  Default instance may not yet be initialized here, so we have to
  //   avoid reading from it.
  if (field->containing_type_ != NULL &&
      &field->containing_type()->options() !=
      &MessageOptions::default_instance() &&
      field->containing_type()->options().message_set_wire_format()) {
    if (field->is_extension()) {
      if (!field->is_optional() ||
          field->type() != FieldDescriptor::TYPE_MESSAGE) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "Extensions of MessageSets must be optional messages.");
      }
    } else {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "MessageSets cannot have fields, only extensions.");
    }
  }

  // Lite extensions can only be of Lite types.
  if (IsLite(field->file()) &&
      field->containing_type_ != NULL &&
      !IsLite(field->containing_type()->file())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite "
             "files.  Note that you cannot extend a non-lite type to contain "
             "a lite type, but the reverse is allowed.");
  }

}